

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::ParsedValues::add(ParsedValues *this,string *name,string *value)

{
  bool bVar1;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  *in_RDI;
  char *unaff_retaddr;
  OptionContext *in_stack_00000008;
  string *in_stack_00000010;
  option_iterator it;
  OptionContext *this_00;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  local_20 [3];
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  *p_Var2;
  
  this_00 = (OptionContext *)in_RDI->_M_current;
  p_Var2 = in_RDI;
  std::__cxx11::string::c_str();
  local_20[0]._M_current =
       (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
       OptionContext::tryFind(in_stack_00000008,unaff_retaddr,(FindType)((ulong)p_Var2 >> 0x20));
  OptionContext::end(this_00);
  bVar1 = __gnu_cxx::operator!=
                    (in_RDI,(__normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
                             *)this_00);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
    ::operator*(local_20);
    add((ParsedValues *)value,it._M_current,in_stack_00000010);
  }
  return;
}

Assistant:

void ParsedValues::add(const std::string& name, const std::string& value) {
	OptionContext::option_iterator it = ctx->tryFind(name.c_str());
	if (it != ctx->end()) {
		add(*it, value);
	}
}